

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  pointer pfVar1;
  pointer pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  double dVar21;
  uint uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  float fVar25;
  
  if ((this->quant_ == true) &&
     (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout ==
      true)) {
    Vector::mul(output,(this->qwo_).
                       super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                hidden);
  }
  else {
    Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,hidden);
  }
  pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar24 = ZEXT464((uint)*pfVar2);
  if (0 < (long)this->osz_) {
    lVar16 = 0;
    do {
      auVar8 = vmaxss_avx(auVar24._0_16_,ZEXT416((uint)pfVar2[lVar16]));
      auVar24 = ZEXT1664(auVar8);
      lVar16 = lVar16 + 1;
    } while (this->osz_ != lVar16);
  }
  iVar15 = this->osz_;
  fVar25 = 0.0;
  if (0 < iVar15) {
    lVar16 = 0;
    uVar22 = auVar24._0_4_;
    do {
      dVar21 = exp((double)((output->data_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar16] - auVar24._0_4_));
      auVar24 = ZEXT464(uVar22);
      (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar16] = (float)dVar21;
      fVar25 = fVar25 + (float)dVar21;
      lVar16 = lVar16 + 1;
      iVar15 = this->osz_;
    } while (lVar16 < iVar15);
  }
  if (0 < iVar15) {
    pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar18 = vpbroadcastq_avx512vl();
    auVar23._4_4_ = fVar25;
    auVar23._0_4_ = fVar25;
    auVar23._8_4_ = fVar25;
    auVar23._12_4_ = fVar25;
    auVar23._16_4_ = fVar25;
    auVar23._20_4_ = fVar25;
    auVar23._24_4_ = fVar25;
    auVar23._28_4_ = fVar25;
    uVar17 = 0;
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      auVar19 = vpbroadcastq_avx512vl();
      auVar20 = vpor_avx2(auVar19,auVar9);
      auVar19 = vpor_avx2(auVar19,auVar10);
      uVar11 = vpcmpuq_avx512vl(auVar19,auVar18,2);
      bVar14 = (byte)uVar11;
      uVar11 = vpcmpuq_avx512vl(auVar20,auVar18,2);
      bVar13 = (byte)uVar11;
      bVar12 = bVar13 << 4;
      pfVar1 = pfVar2 + uVar17;
      auVar20._4_4_ = (uint)((bVar14 & 2) >> 1) * (int)pfVar1[1];
      auVar20._0_4_ = (uint)(bVar14 & 1) * (int)*pfVar1;
      auVar20._8_4_ = (uint)((bVar14 & 4) >> 2) * (int)pfVar1[2];
      auVar20._12_4_ = (uint)((bVar14 & 0xf) >> 3) * (int)pfVar1[3];
      auVar20._16_4_ = (uint)(bVar13 & 1) * (int)pfVar1[4];
      auVar20._20_4_ = (uint)(bVar12 >> 5 & 1) * (int)pfVar1[5];
      auVar20._24_4_ = (uint)(bVar12 >> 6 & 1) * (int)pfVar1[6];
      auVar20._28_4_ = (uint)(bVar12 >> 7) * (int)pfVar1[7];
      auVar20 = vdivps_avx(auVar20,auVar23);
      pfVar1 = pfVar2 + uVar17;
      bVar3 = (bool)((bVar14 & 2) >> 1);
      bVar4 = (bool)((bVar14 & 4) >> 2);
      bVar5 = (bool)((bVar14 & 0xf) >> 3);
      bVar6 = (bool)(bVar12 >> 5 & 1);
      bVar7 = (bool)(bVar12 >> 6 & 1);
      *pfVar1 = (float)((uint)(bVar14 & 1) * auVar20._0_4_ |
                       (uint)!(bool)(bVar14 & 1) * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar4 * auVar20._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)(bVar13 & 1) * auVar20._16_4_ |
                         (uint)!(bool)(bVar13 & 1) * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar20._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar20._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)(bVar12 >> 7) * auVar20._28_4_ |
                         (uint)!(bool)(bVar12 >> 7) * (int)pfVar1[7]);
      uVar17 = uVar17 + 8;
    } while ((iVar15 + 7U & 0xfffffff8) != uVar17);
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  if (quant_ && args_->qout) {
    output.mul(*qwo_, hidden);
  } else {
    output.mul(*wo_, hidden);
  }
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}